

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

int Cec_ManCheckNonTrivialCands(Gia_Man_t *pAig)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int v;
  long lVar4;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    while ((iVar3 < pAig->vCos->nSize - pAig->nRegs &&
           (pGVar2 = Gia_ManCo(pAig,iVar3), pGVar2 != (Gia_Obj_t *)0x0))) {
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) | 0x40000000;
      iVar3 = iVar3 + 1;
    }
    lVar4 = 0;
    while ((iVar3 = 0, lVar4 < pAig->nObjs &&
           (pGVar2 = Gia_ManObj(pAig,(int)lVar4), iVar3 = 0, pGVar2 != (Gia_Obj_t *)0x0))) {
      uVar1 = *(uint *)pGVar2;
      if (((uVar1 >> 0x1e & 1) == 0) &&
         (((~uVar1 & 0x9fffffff) == 0 || -1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0 &&
          (iVar3 = 1, (~(uint)pAig->pReprs[lVar4] & 0xfffffff) != 0)))) break;
      lVar4 = lVar4 + 1;
    }
    v = 0;
    while ((v < pAig->vCos->nSize - pAig->nRegs &&
           (pGVar2 = Gia_ManCo(pAig,v), pGVar2 != (Gia_Obj_t *)0x0))) {
      *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) =
           *(ulong *)(pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)) &
           0xffffffffbfffffff;
      v = v + 1;
    }
  }
  return iVar3;
}

Assistant:

int Cec_ManCheckNonTrivialCands( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 0;
    if ( pAig->pReprs == NULL )
        return 0;
    // label internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // check if there are non-labled equivs
    Gia_ManForEachObj( pAig, pObj, i )
        if ( Gia_ObjIsCand(pObj) && !pObj->fMark0 && Gia_ObjRepr(pAig, i) != GIA_VOID )
        {
            RetValue = 1;
            break;
        }
    // clean internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;
    return RetValue;
}